

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

int cs_impl::conio::getch(void)

{
  int iVar1;
  
  terminal_lnbuf(0);
  terminal_echo(0);
  iVar1 = getchar();
  terminal_lnbuf(1);
  terminal_echo(1);
  return iVar1;
}

Assistant:

int getch()
		{
			terminal_lnbuf(0);
			terminal_echo(0);
			int ch = getchar();
			terminal_lnbuf(1);
			terminal_echo(1);
			return ch;
		}